

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall Loop::SetHasYield(Loop *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *pLVar4;
  
  do {
    if ((*(ushort *)&this->field_0x178 & 0x10) != 0) {
      pLVar4 = this->parent;
      if (pLVar4 == (Loop *)0x0) {
        return;
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        if ((pLVar4->field_0x178 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xddb,"(current->hasYield)","current->hasYield");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        pLVar4 = pLVar4->parent;
      } while (pLVar4 != (Loop *)0x0);
      return;
    }
    *(ushort *)&this->field_0x178 = *(ushort *)&this->field_0x178 | 0x10;
    this = this->parent;
  } while (this != (Loop *)0x0);
  return;
}

Assistant:

void
Loop::SetHasYield()
{
    Loop* current = this;
    do
    {
        if (current->hasYield)
        {
#if DBG
            current = current->parent;
            while (current)
            {
                Assert(current->hasYield);
                current = current->parent;
            }
#endif
            break;
        }
        current->hasYield = true;
        current = current->parent;
    } while (current != nullptr);
}